

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd.c
# Opt level: O3

int get_token_from_fp(FILE *fp,char *buff,char d)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  *buff = '\0';
  iVar2 = feof((FILE *)fp);
  if (iVar2 == 0) {
    uVar3 = fgetc((FILE *)fp);
    uVar4 = (uint)(char)uVar3;
    uVar1 = (uint)(byte)d;
    iVar2 = 0;
    if (uVar4 != uVar1) {
      if ((char)uVar3 == '\n' || (uVar3 & 0xfb) == 9) {
        do {
          iVar2 = feof((FILE *)fp);
          if (iVar2 != 0) goto LAB_0016ddd9;
          uVar3 = getc((FILE *)fp);
        } while ((uVar3 & 0xfb) == 9 || (char)uVar3 == '\n');
        uVar4 = (uint)(char)uVar3;
      }
      uVar5 = 0;
      if ((uVar3 & 0xff) != 10 && uVar4 != uVar1) {
        uVar5 = 0;
        while (iVar2 = feof((FILE *)fp), iVar2 == 0) {
          buff[uVar5] = (char)uVar3;
          uVar3 = fgetc((FILE *)fp);
          uVar5 = uVar5 + 1;
          if ((((uVar3 & 0xfb) == 9) || ((uVar3 & 0xff) == 10)) || ((int)(char)uVar3 == uVar1))
          break;
        }
      }
      iVar2 = (int)uVar5;
      buff = buff + (uVar5 & 0xffffffff);
    }
    *buff = '\0';
  }
  else {
LAB_0016ddd9:
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int get_token_from_fp(FILE * fp, char *buff, char d)
{
   char c;
   int i;

   buff[0] = '\0';

   if (feof(fp))
      return 0;
   c = fgetc(fp);
   if (c == d) {
      buff[0] = '\0';
      return 0;
   }

   while (c == '\n' || c == '\r' || c == '\t') {
      if (feof(fp))
         return 0;
      c = getc(fp);
   }

   for (i = 0; c != d && c != '\n' && c != '\r' && c != '\t' && !feof(fp); i++) {
      buff[i] = c;
      c = fgetc(fp);
   }

   buff[i] = '\0';
   return i;
}